

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool wildcard_match_rec(char *wildcard,char *target)

{
  char firstbyte;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char cVar4;
  
  cVar4 = *target;
  do {
    while( true ) {
      if (cVar4 == '\0') {
        do {
          cVar4 = *wildcard;
          wildcard = wildcard + 1;
        } while (cVar4 == '*');
        return cVar4 == '\0';
      }
      firstbyte = *wildcard;
      if (firstbyte == '\0') {
        return false;
      }
      sVar2 = GetUTF8Length(firstbyte);
      sVar3 = GetUTF8Length(cVar4);
      if (firstbyte != '?') break;
LAB_00140858:
      cVar4 = target[sVar3];
      wildcard = wildcard + sVar2;
      target = target + sVar3;
    }
    if (firstbyte != '*') {
      if (firstbyte != cVar4) {
        return false;
      }
      goto LAB_00140858;
    }
    if (wildcard[sVar2] == '\0') {
      return true;
    }
    _Var1 = wildcard_match_rec(wildcard,target + sVar3);
    wildcard = wildcard + sVar2;
    if (_Var1) {
      return true;
    }
  } while( true );
}

Assistant:

bool wildcard_match_rec(const char *wildcard, const char *target)
{
	const char *pw = wildcard;
	const char *pt = target;
	while (true)
	{
		if (*pt == '\0')
		{
			while (*pw != '\0')
			{
				if (*pw++ != '*')
				{
					return false;
				}
			}
			return true;
		}
		else if (*pw == '\0')
		{
			return false;
		}
		size_t w_skip = get_step_filechar((unsigned char *)pw);
		size_t t_skip = get_step_filechar((unsigned char *)pt);
		if (*pw == '*')
		{
			if (*(pw + w_skip) == '\0')
			{
				return true;
			}
			else if (wildcard_match_rec(pw, pt + t_skip))
			{
				return true;
			}
			else
			{
				return wildcard_match_rec(pw + w_skip, pt);
			}
		}
		else if (*pw == '?' || (*pw == *pt))
		{
			pw += w_skip;
			pt += t_skip;
			continue;
		}
		else
		{
			return false;
		}
	}
}